

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecInt.h
# Opt level: O3

void Vec_IntSetEntry(Vec_Int_t *p,int i,int Entry)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  
  iVar3 = p->nSize;
  if (i < iVar3) goto LAB_00498f7d;
  iVar1 = i + 1;
  iVar2 = p->nCap;
  if (i < iVar2 * 2) {
    if (iVar2 <= i) {
      if (p->pArray == (int *)0x0) {
        piVar4 = (int *)malloc((long)iVar2 << 3);
      }
      else {
        piVar4 = (int *)realloc(p->pArray,(long)iVar2 << 3);
      }
      p->pArray = piVar4;
      iVar3 = iVar2 * 2;
LAB_00498f4c:
      if (piVar4 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x215,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      p->nCap = iVar3;
      iVar3 = p->nSize;
    }
  }
  else if (iVar2 <= i) {
    if (p->pArray == (int *)0x0) {
      piVar4 = (int *)malloc((long)iVar1 << 2);
    }
    else {
      piVar4 = (int *)realloc(p->pArray,(long)iVar1 << 2);
    }
    p->pArray = piVar4;
    iVar3 = iVar1;
    goto LAB_00498f4c;
  }
  if (iVar3 <= i) {
    memset(p->pArray + iVar3,0,(ulong)(uint)(i - iVar3) * 4 + 4);
  }
  p->nSize = iVar1;
  iVar3 = iVar1;
LAB_00498f7d:
  if ((-1 < i) && (i < iVar3)) {
    p->pArray[(uint)i] = Entry;
    return;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                ,0x1c9,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
}

Assistant:

static inline void Vec_IntSetEntry( Vec_Int_t * p, int i, int Entry )
{
    Vec_IntFillExtra( p, i + 1, 0 );
    Vec_IntWriteEntry( p, i, Entry );
}